

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

rule * Rule_merge(rule *pA,rule *pB)

{
  rule *prVar1;
  rule *prVar2;
  rule *prVar3;
  rule **ppPrev;
  rule *pFirst;
  rule *pB_local;
  rule *pA_local;
  
  pFirst = (rule *)0x0;
  ppPrev = &pFirst;
  pB_local = pB;
  pA_local = pA;
  while (pA_local != (rule *)0x0 && pB_local != (rule *)0x0) {
    if (pA_local->iRule < pB_local->iRule) {
      *ppPrev = pA_local;
      prVar2 = pB_local;
      prVar3 = pA_local->next;
      prVar1 = pA_local;
    }
    else {
      *ppPrev = pB_local;
      prVar2 = pB_local->next;
      prVar3 = pA_local;
      prVar1 = pB_local;
    }
    pA_local = prVar3;
    pB_local = prVar2;
    ppPrev = &prVar1->next;
  }
  if (pA_local == (rule *)0x0) {
    *ppPrev = pB_local;
  }
  else {
    *ppPrev = pA_local;
  }
  return pFirst;
}

Assistant:

static struct rule *Rule_merge(struct rule *pA, struct rule *pB){
  struct rule *pFirst = 0;
  struct rule **ppPrev = &pFirst;
  while( pA && pB ){
    if( pA->iRule<pB->iRule ){
      *ppPrev = pA;
      ppPrev = &pA->next;
      pA = pA->next;
    }else{
      *ppPrev = pB;
      ppPrev = &pB->next;
      pB = pB->next;
    }
  }
  if( pA ){
    *ppPrev = pA;
  }else{
    *ppPrev = pB;
  }
  return pFirst;
}